

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  int iVar14;
  byte *pbVar15;
  int iVar16;
  uint uVar17;
  longdouble lVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined4 uVar25;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double rr [2];
  
  *pResult = 0.0;
  if (length != 0) {
    if (enc == '\x01') {
      iVar12 = 1;
      lVar10 = 1;
      pbVar13 = (byte *)z;
    }
    else {
      iVar12 = 1;
      for (lVar10 = (long)(int)(3 - (uint)enc); lVar10 < (int)(length & 0xfffffffe);
          lVar10 = lVar10 + 2) {
        if (z[lVar10] != '\0') {
          iVar12 = -100;
          break;
        }
      }
      length = (uint)lVar10 ^ 1;
      pbVar13 = (byte *)(z + (enc & 1));
      lVar10 = 2;
    }
    pbVar15 = (byte *)(z + length);
    for (; pbVar13 < pbVar15; pbVar13 = pbVar13 + lVar10) {
      bVar2 = *pbVar13;
      if ((""[bVar2] & 1) == 0) {
        uVar7 = 0;
        lVar9 = 0;
        if ((bVar2 - 0x2b & 0xfd) == 0) {
          lVar9 = lVar10;
        }
        pbVar13 = pbVar13 + lVar9;
        iVar11 = 1;
        iVar8 = 0;
        iVar14 = 0;
        goto LAB_00134ce0;
      }
    }
  }
  return 0;
LAB_00134ce0:
  bVar5 = 1;
  iVar16 = 0;
  if (pbVar13 < pbVar15) {
    bVar3 = *pbVar13;
    if (0xfffffffffffffff5 < (ulong)bVar3 - 0x3a) {
      uVar7 = (uVar7 * 10 + (long)(char)bVar3) - 0x30;
      pbVar13 = pbVar13 + lVar10;
      iVar14 = iVar14 + 1;
      if (0x1999999999999997 < uVar7) {
        for (; (pbVar13 < pbVar15 && (0xfffffffffffffff5 < (ulong)*pbVar13 - 0x3a));
            pbVar13 = pbVar13 + lVar10) {
          iVar8 = iVar8 + 1;
        }
      }
      goto LAB_00134ce0;
    }
    if (bVar3 == 0x2e) {
      iVar12 = iVar12 + 1;
      while ((pbVar1 = pbVar13 + lVar10, pbVar1 < pbVar15 &&
             (0xfffffffffffffff5 < (ulong)*pbVar1 - 0x3a))) {
        pbVar13 = pbVar1;
        if (uVar7 < 0x1999999999999998) {
          uVar7 = (uVar7 * 10 + (long)(char)*pbVar1) - 0x30;
          iVar8 = iVar8 + -1;
          iVar14 = iVar14 + 1;
        }
      }
      pbVar13 = pbVar13 + lVar10;
    }
    iVar11 = 1;
    iVar16 = 0;
    if (pbVar13 < pbVar15) {
      if ((*pbVar13 | 0x20) == 0x65) {
        pbVar13 = pbVar13 + lVar10;
        iVar12 = iVar12 + 1;
        if (pbVar15 <= pbVar13) {
          iVar16 = 0;
          iVar11 = 1;
          bVar5 = 0;
          goto LAB_00134dfa;
        }
        iVar11 = 1;
        if (*pbVar13 == 0x2b) {
          pbVar13 = pbVar13 + lVar10;
        }
        else if (*pbVar13 == 0x2d) {
          pbVar13 = pbVar13 + lVar10;
          iVar11 = -1;
        }
        iVar16 = 0;
        bVar5 = 0;
        for (; (pbVar13 < pbVar15 && (0xfffffffffffffff5 < (ulong)*pbVar13 - 0x3a));
            pbVar13 = pbVar13 + lVar10) {
          bVar4 = 9999 < iVar16;
          iVar16 = iVar16 * 10 + -0x30 + (int)(char)*pbVar13;
          if (bVar4) {
            iVar16 = 10000;
          }
          bVar5 = 1;
        }
      }
      else {
        bVar5 = 1;
        iVar16 = 0;
        iVar11 = 1;
      }
      while ((pbVar13 < pbVar15 && ((""[*pbVar13] & 1) != 0))) {
        pbVar13 = pbVar13 + lVar10;
      }
    }
  }
LAB_00134dfa:
  if (uVar7 == 0) {
    if (bVar2 == 0x2d) {
      dVar19 = -0.0;
    }
    else {
      dVar19 = 0.0;
    }
  }
  else {
    uVar17 = iVar16 * iVar11 + iVar8;
    for (; (0 < (int)uVar17 && (uVar7 < 0x1999999999999999)); uVar7 = uVar7 * 10) {
      uVar17 = uVar17 - 1;
    }
    while( true ) {
      if ((-1 < (int)uVar17) || (uVar7 % 10 != 0)) break;
      uVar17 = uVar17 + 1;
      uVar7 = uVar7 / 10;
    }
    uVar25 = (undefined4)(uVar7 >> 0x20);
    if (uVar17 == 0) {
      auVar22._8_4_ = uVar25;
      auVar22._0_8_ = uVar7;
      auVar22._12_4_ = 0x45300000;
      dVar19 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
    }
    else if (sqlite3Config.bUseLongDouble == '\0') {
      auVar20._8_4_ = uVar25;
      auVar20._0_8_ = uVar7;
      auVar20._12_4_ = 0x45300000;
      rr[0] = (auVar20._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
      uVar6 = (long)(rr[0] - 9.223372036854776e+18) & (long)rr[0] >> 0x3f | (long)rr[0];
      lVar10 = uVar7 - uVar6;
      if (uVar7 < uVar6) {
        lVar10 = uVar6 - uVar7;
        auVar23._8_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar23._0_8_ = lVar10;
        auVar23._12_4_ = 0x45300000;
        rr[1] = -((auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
      }
      else {
        auVar24._8_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar24._0_8_ = lVar10;
        auVar24._12_4_ = 0x45300000;
        rr[1] = (auVar24._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
      }
      if ((int)uVar17 < 1) {
        for (; (int)uVar17 < -99; uVar17 = uVar17 + 100) {
          dekkerMul2(rr,1e-100,-1.9991899802602883e-117);
        }
        for (; (int)uVar17 < -9; uVar17 = uVar17 + 10) {
          dekkerMul2(rr,1e-10,-3.643219731549774e-27);
        }
        for (; (int)uVar17 < 0; uVar17 = uVar17 + 1) {
          dekkerMul2(rr,0.1,-5.551115123125783e-18);
        }
      }
      else {
        for (; 99 < uVar17; uVar17 = uVar17 - 100) {
          dekkerMul2(rr,1e+100,-1.5902891109759918e+83);
        }
        for (; 9 < uVar17; uVar17 = uVar17 - 10) {
          dekkerMul2(rr,10000000000.0,0.0);
        }
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          dekkerMul2(rr,10.0,0.0);
        }
      }
      dVar19 = rr[0] + rr[1];
      dVar21 = dVar19;
      if (((ulong)dVar19 & 0xfffffffffffff) != 0) {
        dVar21 = INFINITY;
      }
      if ((~(ulong)dVar19 & 0x7ff0000000000000) == 0) {
        dVar19 = dVar21;
      }
    }
    else {
      lVar18 = (longdouble)(long)uVar7 +
               (longdouble)*(float *)(&DAT_001a96f8 + (ulong)((long)uVar7 < 0) * 4);
      if ((int)uVar17 < 1) {
        for (; (int)uVar17 < -99; uVar17 = uVar17 + 100) {
          lVar18 = lVar18 * _DAT_001a94c0;
        }
        for (; (int)uVar17 < -9; uVar17 = uVar17 + 10) {
          lVar18 = lVar18 * _DAT_001a94e0;
        }
        for (; (int)uVar17 < 0; uVar17 = uVar17 + 1) {
          lVar18 = lVar18 * _DAT_001a94f0;
        }
      }
      else {
        for (; 99 < uVar17; uVar17 = uVar17 - 100) {
          lVar18 = lVar18 * _DAT_001a9510;
        }
        for (; 9 < uVar17; uVar17 = uVar17 - 10) {
          lVar18 = lVar18 * (longdouble)1e+10;
        }
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          lVar18 = lVar18 * (longdouble)10.0;
        }
      }
      dVar19 = (double)lVar18;
      if ((longdouble)1.79769313486232e+308 < lVar18) {
        dVar19 = INFINITY;
      }
    }
    *pResult = dVar19;
    if (bVar2 != 0x2d) goto LAB_0013513b;
    dVar19 = -dVar19;
  }
  *pResult = dVar19;
LAB_0013513b:
  if ((bool)((0 < iVar14 && pbVar13 == pbVar15) & bVar5 & 0 < iVar12)) {
    return iVar12;
  }
  if ((1 < iVar12) && ((bool)((bVar5 | iVar12 == 3) & 0 < iVar14))) {
    return -1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<(LARGEST_UINT64/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  if( e==0 ){
    *pResult = s;
  }else if( sqlite3Config.bUseLongDouble ){
    LONGDOUBLE_TYPE r = (LONGDOUBLE_TYPE)s;
    if( e>0 ){
      while( e>=100  ){ e-=100; r *= 1.0e+100L; }
      while( e>=10   ){ e-=10;  r *= 1.0e+10L;  }
      while( e>=1    ){ e-=1;   r *= 1.0e+01L;  }
    }else{
      while( e<=-100 ){ e+=100; r *= 1.0e-100L; }
      while( e<=-10  ){ e+=10;  r *= 1.0e-10L;  }
      while( e<=-1   ){ e+=1;   r *= 1.0e-01L;  }
    }
    assert( r>=0.0 );
    if( r>+1.7976931348623157081452742373e+308L ){
#ifdef INFINITY
      *pResult = +INFINITY;
#else
      *pResult = 1.0e308*10.0;
#endif
    }else{
      *pResult = (double)r;
    }
  }else{
    double rr[2];
    u64 s2;
    rr[0] = (double)s;
    s2 = (u64)rr[0];
#if defined(_MSC_VER) && _MSC_VER<1700
    if( s2==0x8000000000000000LL ){ s2 = 2*(u64)(0.5*rr[0]); }
#endif
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
    if( e>0 ){
      while( e>=100  ){
        e -= 100;
        dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
      }
      while( e>=10   ){
        e -= 10;
        dekkerMul2(rr, 1.0e+10, 0.0);
      }
      while( e>=1    ){
        e -= 1;
        dekkerMul2(rr, 1.0e+01, 0.0);
      }
    }else{
      while( e<=-100 ){
        e += 100;
        dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
      }
      while( e<=-10  ){
        e += 10;
        dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
      }
      while( e<=-1   ){
        e += 1;
        dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
      }
    }
    *pResult = rr[0]+rr[1];
    if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  }
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}